

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O1

int USHAFinalBits(USHAContext *ctx,uint8_t bits,uint bitcount)

{
  int iVar1;
  
  if (ctx != (USHAContext *)0x0) {
    switch(ctx->whichSha) {
    case 0:
      iVar1 = SHA1FinalBits(&(ctx->ctx).sha1Context,bits,bitcount);
      return iVar1;
    case 1:
      iVar1 = SHA224FinalBits(&(ctx->ctx).sha224Context,bits,bitcount);
      return iVar1;
    case 2:
      iVar1 = SHA256FinalBits(&(ctx->ctx).sha256Context,bits,bitcount);
      return iVar1;
    case 3:
      iVar1 = SHA384FinalBits(&(ctx->ctx).sha384Context,bits,bitcount);
      return iVar1;
    case 4:
      iVar1 = SHA512FinalBits(&(ctx->ctx).sha512Context,bits,bitcount);
      return iVar1;
    default:
      return 4;
    }
  }
  return 1;
}

Assistant:

int USHAFinalBits(USHAContext *ctx,
const uint8_t bits, unsigned int bitcount)
{
    if (ctx) {
        switch (ctx->whichSha) {
        case SHA1:
            return SHA1FinalBits((SHA1Context*)&ctx->ctx, bits, bitcount);
        case SHA224:
            return SHA224FinalBits((SHA224Context*)&ctx->ctx, bits,
                bitcount);
        case SHA256:
            return SHA256FinalBits((SHA256Context*)&ctx->ctx, bits,
                bitcount);
        case SHA384:
            return SHA384FinalBits((SHA384Context*)&ctx->ctx, bits,
                bitcount);
        case SHA512:
            return SHA512FinalBits((SHA512Context*)&ctx->ctx, bits,
                bitcount);
        default: return shaBadParam;
        }
    }
    else {
        return shaNull;
    }
}